

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O0

void __thiscall bsplib::Rdma::ActionBuf::execute(ActionBuf *this,Rdma *rdma)

{
  int pid_00;
  void *pvVar1;
  undefined4 uVar2;
  ulong uVar3;
  unsigned_long x;
  size_t sVar4;
  size_type sVar5;
  reference pvVar6;
  Memblock *pMVar7;
  unsigned_long in_R8;
  unsigned_long x_00;
  char *addr_2;
  char *addr_1;
  char *addr;
  Action a;
  ulong local_28;
  size_t i;
  int pid;
  Rdma *rdma_local;
  ActionBuf *this_local;
  
  pid_00 = rdma->m_pid;
  for (local_28 = 0;
      sVar5 = std::vector<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>::size
                        (&this->m_actions), local_28 < sVar5; local_28 = local_28 + 1) {
    pvVar6 = std::vector<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>::operator[]
                       (&this->m_actions,local_28);
    x_00 = pvVar6->size;
    uVar2 = pvVar6->kind;
    uVar3._0_4_ = pvVar6->src_pid;
    uVar3._4_4_ = pvVar6->dst_pid;
    x = pvVar6->dst_slot;
    sVar4 = pvVar6->offset;
    if (uVar2 == 0) {
      pMVar7 = slot(rdma,pid_00,pvVar6->src_slot);
      pvVar1 = pMVar7->addr;
      serial<unsigned_long>(&rdma->m_second_exchange,uVar3._4_4_,x_00);
      serial<unsigned_long>(&rdma->m_second_exchange,uVar3._4_4_,x);
      A2A::send(&rdma->m_second_exchange,uVar3._4_4_,(void *)(sVar4 + (long)pvVar1),x_00,(int)in_R8)
      ;
    }
    else {
      a.src_pid = (int)*(undefined8 *)&pvVar6->tag;
      if (uVar2 == 1) {
        pMVar7 = slot(rdma,pid_00,x);
        Unbuf::recv(&rdma->m_unbuf,a.src_pid,(void *)(uVar3 & 0xffffffff),sVar4 + (long)pMVar7->addr
                    ,(int)x_00);
        in_R8 = x_00;
      }
      else if (uVar2 == 2) {
        pMVar7 = slot(rdma,pid_00,pvVar6->src_slot);
        Unbuf::send(&rdma->m_unbuf,a.src_pid,(void *)(ulong)(uint)uVar3._4_4_,
                    sVar4 + (long)pMVar7->addr,(int)x_00);
        in_R8 = x_00;
      }
    }
  }
  return;
}

Assistant:

void Rdma::ActionBuf::execute( Rdma & rdma )
{
    const int pid = rdma.m_pid;
    for (size_t i = 0; i < m_actions.size(); ++i ) 
    {
        Action a = m_actions[i];
#ifdef PROFILE
        TicToc t( a.kind==Action::GET? TicToc::GET:
                  a.kind==Action::HPPUT? TicToc::HPPUT:
                  TicToc::HPGET );
#endif
        switch( a.kind ) {
            case Action::GET : {
#ifdef PROFILE
                size_t start=rdma.m_second_exchange.send_size(a.dst_pid);
#endif
                char * addr = static_cast< char *>( 
                        rdma.slot( pid, a.src_slot ).addr );
                addr += a.offset;
                serial( rdma.m_second_exchange, a.dst_pid, a.size );
                serial( rdma.m_second_exchange, a.dst_pid, a.dst_slot );
                rdma.m_second_exchange.send( a.dst_pid, addr, a.size );
#ifdef PROFILE
                size_t end=rdma.m_second_exchange.send_size(a.dst_pid);
                t.add_bytes(end-start);
#endif
                break;
            }

            case Action::HPPUT : {
                char * addr = static_cast< char *>(
                        rdma.slot( pid, a.dst_slot ).addr );
                addr += a.offset;
                rdma.m_unbuf.recv( a.tag, a.src_pid, addr, a.size );
#ifdef PROFILE
                t.add_bytes(a.size);
#endif
                break;
            }

            case Action::HPGET : {
                char * addr = static_cast< char *>(
                        rdma.slot( pid, a.src_slot ).addr );
                addr += a.offset;
                rdma.m_unbuf.send( a.tag, a.dst_pid, addr, a.size );
#ifdef PROFILE
                t.add_bytes(a.size);
#endif
                break;
            }
        }
    }
}